

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Cord * __thiscall absl::lts_20250127::Cord::AssignLargeString(Cord *this,string *src)

{
  ulong uVar1;
  Nonnull<CordRep_*> rep_00;
  Nullable<absl::cord_internal::CordzInfo_*> info;
  CordzUpdateScope local_38;
  CordzUpdateScope scope;
  CordRep *tree;
  CordRep *rep;
  MethodIdentifier method;
  string *src_local;
  Cord *this_local;
  
  uVar1 = std::__cxx11::string::size();
  if (0x1ff < uVar1) {
    rep_00 = CordRepFromString(src);
    scope.info_ = (CordzInfo *)InlineRep::tree(&this->contents_);
    if (scope.info_ == (CordzInfo *)0x0) {
      InlineRep::EmplaceTree(&this->contents_,rep_00,kAssignString);
    }
    else {
      info = InlineRep::cordz_info(&this->contents_);
      cord_internal::CordzUpdateScope::CordzUpdateScope(&local_38,info,kAssignString);
      InlineRep::SetTree(&this->contents_,rep_00,&local_38);
      cord_internal::CordRep::Unref((CordRep *)scope.info_);
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
    }
    return this;
  }
  __assert_fail("src.size() > kMaxBytesToCopy",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x17b,"Cord &absl::Cord::AssignLargeString(std::string &&)");
}

Assistant:

Cord& Cord::AssignLargeString(std::string&& src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  assert(src.size() > kMaxBytesToCopy);
  CordRep* rep = CordRepFromString(std::move(src));
  if (CordRep* tree = contents_.tree()) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    contents_.SetTree(rep, scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(rep, method);
  }
  return *this;
}